

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O3

void anon_unknown.dwarf_f0ff::cmakemainProgressCallback(string *m,float prog,cmake *cm)

{
  cmGlobalGenerator *pcVar1;
  cmMakefile *this;
  int iVar2;
  string *psVar3;
  ostream *poVar4;
  cmake *cm_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string dir;
  char *local_c8;
  long local_c0;
  char local_b8;
  undefined7 uStack_b7;
  string local_a8;
  string local_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  
  if (((cm == (cmake *)0x0) || (cm->DebugOutput != true)) ||
     (pcVar1 = (cm->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
     pcVar1 == (cmGlobalGenerator *)0x0)) {
    local_c8 = &local_b8;
    local_c0 = 0;
    local_b8 = '\0';
  }
  else {
    this = pcVar1->CurrentConfigureMakefile;
    local_c8 = &local_b8;
    local_c0 = 0;
    local_b8 = '\0';
    if (this != (cmMakefile *)0x0) {
      local_88._M_string_length = (size_type)(m->_M_dataplus)._M_p;
      local_88._M_dataplus._M_p = (pointer)m->_M_string_length;
      __str._M_str = "Configuring";
      __str._M_len = 0xb;
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_88,0,0xb,__str);
      if ((0.0 <= prog) || (iVar2 != 0)) {
        local_88._M_string_length = (size_type)(m->_M_dataplus)._M_p;
        local_88._M_dataplus._M_p = (pointer)m->_M_string_length;
        __str_00._M_str = "Generating";
        __str_00._M_len = 10;
        iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_88,0,10,
                           __str_00);
        if (iVar2 != 0) goto LAB_00191757;
        psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
        local_88.field_2._M_allocated_capacity = (long)&local_88.field_2 + 8;
        local_88._M_dataplus._M_p = (char *)0x0;
        local_88._M_string_length = 1;
        local_88.field_2._M_local_buf[8] = ' ';
        local_50.first._M_len = 1;
        local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_30 = (psVar3->_M_dataplus)._M_p;
        local_38 = psVar3->_M_string_length;
        local_28 = 0;
        views_00._M_len = 2;
        views_00._M_array = &local_50;
        local_50.first._M_str = (char *)local_88.field_2._M_allocated_capacity;
        cmCatViews(&local_a8,views_00);
      }
      else {
        psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
        local_88.field_2._M_allocated_capacity = (long)&local_88.field_2 + 8;
        local_88._M_dataplus._M_p = (char *)0x0;
        local_88._M_string_length = 1;
        local_88.field_2._M_local_buf[8] = ' ';
        local_50.first._M_len = 1;
        local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_30 = (psVar3->_M_dataplus)._M_p;
        local_38 = psVar3->_M_string_length;
        local_28 = 0;
        views._M_len = 2;
        views._M_array = &local_50;
        local_50.first._M_str = (char *)local_88.field_2._M_allocated_capacity;
        cmCatViews(&local_a8,views);
      }
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_00191757:
  if ((prog < 0.0) || (local_c0 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-- ",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(m->_M_dataplus)._M_p,m->_M_string_length);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_c8,local_c0);
    (anonymous_namespace)::cmakemainGetStack_abi_cxx11_(&local_88,(_anonymous_namespace_ *)cm,cm_00)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,local_88._M_dataplus._M_p,local_88._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  return;
}

Assistant:

void cmakemainProgressCallback(const std::string& m, float prog, cmake* cm)
{
  cmMakefile* mf = cmakemainGetMakefile(cm);
  std::string dir;
  if (mf && cmHasLiteralPrefix(m, "Configuring") && (prog < 0)) {
    dir = cmStrCat(' ', mf->GetCurrentSourceDirectory());
  } else if (mf && cmHasLiteralPrefix(m, "Generating")) {
    dir = cmStrCat(' ', mf->GetCurrentBinaryDirectory());
  }

  if ((prog < 0) || (!dir.empty())) {
    std::cout << "-- " << m << dir << cmakemainGetStack(cm) << std::endl;
  }
}